

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_line_aa_basics.cpp
# Opt level: O0

void agg::bisectrix(line_parameters *l1,line_parameters *l2,int *x,int *y)

{
  int iVar1;
  double dVar2;
  double dy;
  double dx;
  double ty;
  double tx;
  double k;
  int *y_local;
  int *x_local;
  line_parameters *l2_local;
  line_parameters *l1_local;
  
  ty = -(double)(*(int *)l2 - *(int *)l1) *
       ((double)*(int *)(l2 + 0x28) / (double)*(int *)(l1 + 0x28)) + (double)*(int *)(l2 + 8);
  dx = -(double)(*(int *)(l2 + 4) - *(int *)(l1 + 4)) *
       ((double)*(int *)(l2 + 0x28) / (double)*(int *)(l1 + 0x28)) + (double)*(int *)(l2 + 0xc);
  if ((double)(*(int *)(l2 + 8) - *(int *)l2) * (double)(*(int *)(l2 + 4) - *(int *)(l1 + 4)) <
      (double)(*(int *)(l2 + 0xc) - *(int *)(l2 + 4)) * (double)(*(int *)l2 - *(int *)l1) + 100.0) {
    ty = -(ty - (double)*(int *)l2) + -(ty - (double)*(int *)l2) + ty;
    dx = -(dx - (double)*(int *)(l2 + 4)) + -(dx - (double)*(int *)(l2 + 4)) + dx;
  }
  dVar2 = sqrt((ty - (double)*(int *)l2) * (ty - (double)*(int *)l2) +
               (dx - (double)*(int *)(l2 + 4)) * (dx - (double)*(int *)(l2 + 4)));
  if ((int)dVar2 < 0x100) {
    *x = *(int *)l2 + *(int *)l2 + (*(int *)(l2 + 4) - *(int *)(l1 + 4)) +
         (*(int *)(l2 + 0xc) - *(int *)(l2 + 4)) >> 1;
    *y = ((*(int *)(l2 + 4) + *(int *)(l2 + 4)) - (*(int *)l2 - *(int *)l1)) -
         (*(int *)(l2 + 8) - *(int *)l2) >> 1;
  }
  else {
    iVar1 = iround(ty);
    *x = iVar1;
    iVar1 = iround(dx);
    *y = iVar1;
  }
  return;
}

Assistant:

void bisectrix(const line_parameters& l1, 
                   const line_parameters& l2, 
                   int* x, int* y)
    {
        double k = double(l2.len) / double(l1.len);
        double tx = l2.x2 - (l2.x1 - l1.x1) * k;
        double ty = l2.y2 - (l2.y1 - l1.y1) * k;

        //All bisectrices must be on the right of the line
        //If the next point is on the left (l1 => l2.2)
        //then the bisectix should be rotated by 180 degrees.
        if(double(l2.x2 - l2.x1) * double(l2.y1 - l1.y1) <
           double(l2.y2 - l2.y1) * double(l2.x1 - l1.x1) + 100.0)
        {
            tx -= (tx - l2.x1) * 2.0;
            ty -= (ty - l2.y1) * 2.0;
        }

        // Check if the bisectrix is too short
        double dx = tx - l2.x1;
        double dy = ty - l2.y1;
        if((int)sqrt(dx * dx + dy * dy) < line_subpixel_scale)
        {
            *x = (l2.x1 + l2.x1 + (l2.y1 - l1.y1) + (l2.y2 - l2.y1)) >> 1;
            *y = (l2.y1 + l2.y1 - (l2.x1 - l1.x1) - (l2.x2 - l2.x1)) >> 1;
            return;
        }
        *x = iround(tx);
        *y = iround(ty);
    }